

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O2

uint8_t * libdef_uleb128(uint8_t *p,uint32_t *vv)

{
  byte bVar1;
  byte *pbVar2;
  byte bVar3;
  uint uVar4;
  
  bVar3 = *p;
  uVar4 = (uint)bVar3;
  pbVar2 = p + 1;
  if ((char)bVar3 < '\0') {
    uVar4 = bVar3 & 0x7f;
    bVar3 = 7;
    do {
      bVar1 = *pbVar2;
      uVar4 = uVar4 | (bVar1 & 0x7f) << (bVar3 & 0x1f);
      pbVar2 = pbVar2 + 1;
      bVar3 = bVar3 + 7;
    } while ((char)bVar1 < '\0');
  }
  *vv = uVar4;
  return pbVar2;
}

Assistant:

static uint8_t *libdef_uleb128(uint8_t *p, uint32_t *vv)
{
  uint32_t v = *p++;
  if (v >= 0x80) {
    int sh = 0; v &= 0x7f;
    do { v |= ((*p & 0x7f) << (sh += 7)); } while (*p++ >= 0x80);
  }
  *vv = v;
  return p;
}